

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void google::protobuf::StripWhitespace(string *str)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pcVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar5 = str->_M_string_length;
  uVar8 = (uint)uVar5;
  if ((int)uVar8 < 1) {
    if (uVar8 != 0) {
      return;
    }
  }
  else {
    uVar9 = 0;
    do {
      uVar6 = uVar5;
      if (uVar5 == uVar9) goto LAB_002c1e9b;
      bVar1 = (str->_M_dataplus)._M_p[uVar9];
      if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
        if (uVar8 != (uint)uVar9) {
          if (uVar9 != 0) {
            std::__cxx11::string::erase((ulong)str,0);
            uVar6 = (ulong)(uVar8 - (uint)uVar9);
          }
          if ((int)uVar6 < 1) {
            return;
          }
          uVar5 = str->_M_string_length;
          lVar3 = -(uVar6 & 0xffffffff);
          iVar4 = 0;
          goto LAB_002c1e3d;
        }
        break;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar9);
  }
  str->_M_string_length = 0;
  pcVar7 = (str->_M_dataplus)._M_p;
LAB_002c1e85:
  *pcVar7 = '\0';
  return;
LAB_002c1e3d:
  iVar2 = (int)uVar6;
  uVar6 = (ulong)(iVar2 - 1);
  if (uVar5 <= uVar6) {
LAB_002c1e9b:
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar6,uVar5);
  }
  pcVar7 = (str->_M_dataplus)._M_p;
  bVar1 = pcVar7[uVar6];
  if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
    if (iVar4 == 0) {
      return;
    }
    pcVar7 = pcVar7 + -lVar3;
    str->_M_string_length = -lVar3;
    goto LAB_002c1e85;
  }
  lVar3 = lVar3 + 1;
  iVar4 = iVar4 + 1;
  uVar6 = (ulong)(iVar2 - 1U);
  if (iVar2 - 1U == 0 || iVar2 < 1) {
    return;
  }
  goto LAB_002c1e3d;
}

Assistant:

void StripWhitespace(string* str) {
  int str_length = str->length();

  // Strip off leading whitespace.
  int first = 0;
  while (first < str_length && ascii_isspace(str->at(first))) {
    ++first;
  }
  // If entire string is white space.
  if (first == str_length) {
    str->clear();
    return;
  }
  if (first > 0) {
    str->erase(0, first);
    str_length -= first;
  }

  // Strip off trailing whitespace.
  int last = str_length - 1;
  while (last >= 0 && ascii_isspace(str->at(last))) {
    --last;
  }
  if (last != (str_length - 1) && last >= 0) {
    str->erase(last + 1, string::npos);
  }
}